

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _utils.c
# Opt level: O1

void bm_display_results(bm_results_t *results,char *msg)

{
  putchar(10);
  printf("Benchmark results for %s:\n",msg);
  if (0 < results->run1) {
    printf(" -> 1        iteration:    %lli ns. / %i iter. => %Lf ms.\n",results->iter1,1);
  }
  if (0 < results->run10) {
    printf(" -> 10       iterations:   %lli ns. / %i iter. => %Lf ms.\n",results->iter10,10);
  }
  if (0 < results->run100) {
    printf(" -> 100      iterations:   %lli ns. / %i iter. => %Lf ms.\n",results->iter100,100);
  }
  if (0 < results->run1000) {
    printf(" -> 1000     iterations:   %lli ns. / %i iter. => %Lf ms.\n",results->iter1000,1000);
  }
  if (0 < results->run10000) {
    printf(" -> 10000     iterations:   %lli ns. / %i iter. => %Lf ms.\n",results->iter10000,10000);
  }
  puts("---------");
  return;
}

Assistant:

void bm_display_results(const bm_results_t *results, const char *msg) {
    printf("\n");
    printf("Benchmark results for %s:\n", msg);

    if (results->run1 > 0)
        printf(" -> 1        iteration:    %lli ns. / %i iter. => %Lf ms.\n", results->iter1, 1, (long double)results->iter1 / 1000000);

    if (results->run10 > 0)
        printf(" -> 10       iterations:   %lli ns. / %i iter. => %Lf ms.\n", results->iter10, 10, (long double)results->iter10 / 10 / 1000000);

    if (results->run100 > 0)
        printf(" -> 100      iterations:   %lli ns. / %i iter. => %Lf ms.\n", results->iter100, 100, (long double)results->iter100 / 100 / 1000000);

    if (results->run1000 > 0)
        printf(" -> 1000     iterations:   %lli ns. / %i iter. => %Lf ms.\n", results->iter1000, 1000, (long double)results->iter1000 / 1000 / 1000000);

    if (results->run10000 > 0)
        printf(" -> 10000     iterations:   %lli ns. / %i iter. => %Lf ms.\n", results->iter10000, 10000, (long double)results->iter10000 / 10000 / 1000000);

    printf("---------\n");
}